

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * exprTableColumn(sqlite3 *db,Table *pTab,int iCursor,i16 iCol)

{
  Expr *pEVar1;
  Expr *pExpr;
  i16 iCol_local;
  int iCursor_local;
  Table *pTab_local;
  sqlite3 *db_local;
  
  pEVar1 = sqlite3Expr(db,0x9e,(char *)0x0);
  if (pEVar1 != (Expr *)0x0) {
    pEVar1->pTab = pTab;
    pEVar1->iTable = iCursor;
    pEVar1->iColumn = iCol;
  }
  return pEVar1;
}

Assistant:

static Expr *exprTableColumn(
  sqlite3 *db,      /* The database connection */
  Table *pTab,      /* The table whose column is desired */
  int iCursor,      /* The open cursor on the table */
  i16 iCol          /* The column that is wanted */
){
  Expr *pExpr = sqlite3Expr(db, TK_COLUMN, 0);
  if( pExpr ){
    pExpr->pTab = pTab;
    pExpr->iTable = iCursor;
    pExpr->iColumn = iCol;
  }
  return pExpr;
}